

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::ExpectPackedFieldsSet(TestPackedTypesLite *message)

{
  anon_union_280_1_493b367e_for_TestPackedTypesLite_3 *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  internal iVar1;
  const_reference piVar2;
  const_reference plVar3;
  const_reference puVar4;
  const_reference puVar5;
  const_reference pfVar6;
  const_reference pdVar7;
  const_reference pbVar8;
  pointer *__ptr;
  char *pcVar9;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  RepeatedField<int> *local_88;
  RepeatedField<bool> *local_80;
  RepeatedField<double> *local_78;
  RepeatedField<float> *local_70;
  RepeatedField<long> *local_68;
  RepeatedField<int> *local_60;
  RepeatedField<unsigned_long> *local_58;
  RepeatedField<unsigned_int> *local_50;
  RepeatedField<long> *local_48;
  RepeatedField<int> *local_40;
  RepeatedField<unsigned_long> *local_38;
  
  local_c0._M_head_impl._0_4_ = 2;
  this = &message->field_0;
  local_c8.data_._0_4_ =
       (float)internal::SooRep::size
                        ((SooRep *)&this->_impl_,
                         (undefined1  [280])
                         ((undefined1  [280])message->field_0 & (undefined1  [280])0x4) ==
                         (undefined1  [280])0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"2","message.packed_int32_size()",(int *)&local_c0,
             (int *)&local_c8);
  iVar1 = local_b0[0];
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0x29b,pcVar9);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  if (iVar1 != (internal)0x0) {
    local_c0._M_head_impl._0_4_ = 2;
    this_00 = &(message->field_0)._impl_.packed_int64_;
    local_c8.data_._0_4_ =
         (float)internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0x18) & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b0,"2","message.packed_int64_size()",(int *)&local_c0,
               (int *)&local_c8);
    iVar1 = local_b0[0];
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c0);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0x29c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (iVar1 != (internal)0x0) {
      local_c0._M_head_impl._0_4_ = 2;
      this_01 = &(message->field_0)._impl_.packed_uint32_;
      local_c8.data_._0_4_ =
           (float)internal::SooRep::size
                            (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0
                            );
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_b0,"2","message.packed_uint32_size()",(int *)&local_c0,
                 (int *)&local_c8);
      iVar1 = local_b0[0];
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0x29d,pcVar9);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      if (iVar1 != (internal)0x0) {
        local_c0._M_head_impl._0_4_ = 2;
        local_38 = &(message->field_0)._impl_.packed_uint64_;
        local_c8.data_._0_4_ =
             (float)internal::SooRep::size
                              (&local_38->soo_rep_,
                               (*(byte *)((long)&message->field_0 + 0x48) & 4) == 0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_b0,"2","message.packed_uint64_size()",(int *)&local_c0,
                   (int *)&local_c8);
        iVar1 = local_b0[0];
        if (local_b0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c0);
          if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_a8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0x29e,pcVar9);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        if (iVar1 != (internal)0x0) {
          local_c0._M_head_impl._0_4_ = 2;
          local_40 = &(message->field_0)._impl_.packed_sint32_;
          local_c8.data_._0_4_ =
               (float)internal::SooRep::size
                                (&local_40->soo_rep_,
                                 (*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_b0,"2","message.packed_sint32_size()",(int *)&local_c0,
                     (int *)&local_c8);
          iVar1 = local_b0[0];
          if (local_b0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar9 = "";
            }
            else {
              pcVar9 = (local_a8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0x29f,pcVar9);
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if (local_c0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_c0._M_head_impl + 8))();
            }
          }
          if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,local_a8);
          }
          if (iVar1 != (internal)0x0) {
            local_c0._M_head_impl._0_4_ = 2;
            local_48 = &(message->field_0)._impl_.packed_sint64_;
            local_c8.data_._0_4_ =
                 (float)internal::SooRep::size
                                  (&local_48->soo_rep_,
                                   (*(byte *)((long)&message->field_0 + 0x78) & 4) == 0);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_b0,"2","message.packed_sint64_size()",(int *)&local_c0,
                       (int *)&local_c8);
            iVar1 = local_b0[0];
            if (local_b0[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_c0);
              if (local_a8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (local_a8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0x2a0,pcVar9);
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
              testing::internal::AssertHelper::~AssertHelper(&local_c8);
              if (local_c0._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_c0._M_head_impl + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            if (iVar1 != (internal)0x0) {
              local_c0._M_head_impl._0_4_ = 2;
              local_50 = &(message->field_0)._impl_.packed_fixed32_;
              local_c8.data_._0_4_ =
                   (float)internal::SooRep::size
                                    (&local_50->soo_rep_,
                                     (*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_b0,"2","message.packed_fixed32_size()",(int *)&local_c0,
                         (int *)&local_c8);
              iVar1 = local_b0[0];
              if (local_b0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_c0);
                if (local_a8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar9 = "";
                }
                else {
                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0x2a1,pcVar9);
                testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                if (local_c0._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                }
              }
              if (local_a8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a8,local_a8);
              }
              if (iVar1 != (internal)0x0) {
                local_c0._M_head_impl._0_4_ = 2;
                local_58 = &(message->field_0)._impl_.packed_fixed64_;
                local_c8.data_._0_4_ =
                     (float)internal::SooRep::size
                                      (&local_58->soo_rep_,
                                       (*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_b0,"2","message.packed_fixed64_size()",(int *)&local_c0
                           ,(int *)&local_c8);
                iVar1 = local_b0[0];
                if (local_b0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_c0);
                  if (local_a8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar9 = "";
                  }
                  else {
                    pcVar9 = (local_a8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0x2a2,pcVar9);
                  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
                  testing::internal::AssertHelper::~AssertHelper(&local_c8);
                  if (local_c0._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                  }
                }
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a8,local_a8);
                }
                if (iVar1 != (internal)0x0) {
                  local_c0._M_head_impl._0_4_ = 2;
                  local_60 = &(message->field_0)._impl_.packed_sfixed32_;
                  local_c8.data_._0_4_ =
                       (float)internal::SooRep::size
                                        (&local_60->soo_rep_,
                                         (*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_b0,"2","message.packed_sfixed32_size()",
                             (int *)&local_c0,(int *)&local_c8);
                  iVar1 = local_b0[0];
                  if (local_b0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_c0);
                    if (local_a8 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar9 = "";
                    }
                    else {
                      pcVar9 = (local_a8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0x2a3,pcVar9);
                    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
                    testing::internal::AssertHelper::~AssertHelper(&local_c8);
                    if (local_c0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_c0._M_head_impl._0_4_ = 2;
                    local_68 = &(message->field_0)._impl_.packed_sfixed64_;
                    local_c8.data_._0_4_ =
                         (float)internal::SooRep::size
                                          (&local_68->soo_rep_,
                                           (*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_b0,"2","message.packed_sfixed64_size()",
                               (int *)&local_c0,(int *)&local_c8);
                    iVar1 = local_b0[0];
                    if (local_b0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_c0);
                      if (local_a8 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar9 = "";
                      }
                      else {
                        pcVar9 = (local_a8->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_c8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0x2a4,pcVar9);
                      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
                      testing::internal::AssertHelper::~AssertHelper(&local_c8);
                      if (local_c0._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                      }
                    }
                    if (local_a8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_a8,local_a8);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_c0._M_head_impl._0_4_ = 2;
                      local_70 = &(message->field_0)._impl_.packed_float_;
                      local_c8.data_._0_4_ =
                           (float)internal::SooRep::size
                                            (&local_70->soo_rep_,
                                             (*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_b0,"2","message.packed_float_size()",
                                 (int *)&local_c0,(int *)&local_c8);
                      iVar1 = local_b0[0];
                      if (local_b0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_c0);
                        if (local_a8 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar9 = "";
                        }
                        else {
                          pcVar9 = (local_a8->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0x2a5,pcVar9);
                        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
                        testing::internal::AssertHelper::~AssertHelper(&local_c8);
                        if (local_c0._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                        }
                      }
                      if (local_a8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_a8,local_a8);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_c0._M_head_impl._0_4_ = 2;
                        local_78 = &(message->field_0)._impl_.packed_double_;
                        local_c8.data_._0_4_ =
                             (float)internal::SooRep::size
                                              (&local_78->soo_rep_,
                                               (*(byte *)((long)&message->field_0 + 0xe0) & 4) == 0)
                        ;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_b0,"2","message.packed_double_size()",
                                   (int *)&local_c0,(int *)&local_c8);
                        iVar1 = local_b0[0];
                        if (local_b0[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_c0);
                          if (local_a8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar9 = "";
                          }
                          else {
                            pcVar9 = (local_a8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_c8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0x2a6,pcVar9);
                          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_c8);
                          if (local_c0._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                          }
                        }
                        if (local_a8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_a8,local_a8);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_c0._M_head_impl._0_4_ = 2;
                          local_80 = &(message->field_0)._impl_.packed_bool_;
                          local_c8.data_._0_4_ =
                               (float)internal::SooRep::size
                                                (&local_80->soo_rep_,
                                                 (*(byte *)((long)&message->field_0 + 0xf0) & 4) ==
                                                 0);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_b0,"2","message.packed_bool_size()",
                                     (int *)&local_c0,(int *)&local_c8);
                          iVar1 = local_b0[0];
                          if (local_b0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_c0);
                            if (local_a8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar9 = "";
                            }
                            else {
                              pcVar9 = (local_a8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_c8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0x2a7,pcVar9);
                            testing::internal::AssertHelper::operator=
                                      (&local_c8,(Message *)&local_c0);
                            testing::internal::AssertHelper::~AssertHelper(&local_c8);
                            if (local_c0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                            }
                          }
                          if (local_a8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_a8,local_a8);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_c0._M_head_impl._0_4_ = 2;
                            local_88 = &(message->field_0)._impl_.packed_enum_;
                            local_c8.data_._0_4_ =
                                 (float)internal::SooRep::size
                                                  (&local_88->soo_rep_,
                                                   (*(byte *)((long)&message->field_0 + 0x100) & 4)
                                                   == 0);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_b0,"2","message.packed_enum_size()",
                                       (int *)&local_c0,(int *)&local_c8);
                            iVar1 = local_b0[0];
                            if (local_b0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_c0);
                              if (local_a8 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar9 = "";
                              }
                              else {
                                pcVar9 = (local_a8->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_c8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0x2a8,pcVar9);
                              testing::internal::AssertHelper::operator=
                                        (&local_c8,(Message *)&local_c0);
                              testing::internal::AssertHelper::~AssertHelper(&local_c8);
                              if (local_c0._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                              }
                            }
                            if (local_a8 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_a8,local_a8);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_c0._M_head_impl._0_4_ = 0x259;
                              piVar2 = RepeatedField<int>::Get(&(this->_impl_).packed_int32_,0);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"601","message.packed_int32(0)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2aa,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.43582e-43;
                              plVar3 = RepeatedField<long>::Get(this_00,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"602","message.packed_int64(0)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2ab,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x25b;
                              puVar4 = RepeatedField<unsigned_int>::Get(this_01,0);
                              local_c8.data_._0_4_ = (float)*puVar4;
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_b0,"603","message.packed_uint32(0)",
                                         (int *)&local_c0,(uint *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2ac,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.46384e-43;
                              puVar5 = RepeatedField<unsigned_long>::Get(local_38,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*puVar5;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_b0,"604","message.packed_uint64(0)",
                                         (int *)&local_c8,(unsigned_long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2ad,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x25d;
                              piVar2 = RepeatedField<int>::Get(local_40,0);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"605","message.packed_sint32(0)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2ae,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.49187e-43;
                              plVar3 = RepeatedField<long>::Get(local_48,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"606","message.packed_sint64(0)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2af,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x25f;
                              puVar4 = RepeatedField<unsigned_int>::Get(local_50,0);
                              local_c8.data_._0_4_ = (float)*puVar4;
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_b0,"607","message.packed_fixed32(0)",
                                         (int *)&local_c0,(uint *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b0,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.51989e-43;
                              puVar5 = RepeatedField<unsigned_long>::Get(local_58,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*puVar5;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_b0,"608","message.packed_fixed64(0)",
                                         (int *)&local_c8,(unsigned_long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b1,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x261;
                              piVar2 = RepeatedField<int>::Get(local_60,0);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"609","message.packed_sfixed32(0)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b2,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.54792e-43;
                              plVar3 = RepeatedField<long>::Get(local_68,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"610","message.packed_sfixed64(0)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b3,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x263;
                              pfVar6 = RepeatedField<float>::Get(local_70,0);
                              local_c8.data_._0_4_ = *pfVar6;
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)local_b0,"611","message.packed_float(0)",
                                         (int *)&local_c0,(float *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b4,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 8.57595e-43;
                              pdVar7 = RepeatedField<double>::Get(local_78,0);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*pdVar7;
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)local_b0,"612","message.packed_double(0)",
                                         (int *)&local_c8,(double *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b5,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_1_ = 1;
                              pbVar8 = RepeatedField<bool>::Get(local_80,0);
                              local_c8.data_._0_4_ = (float)CONCAT31(local_c8.data_._1_3_,*pbVar8);
                              testing::internal::CmpHelperEQ<bool,bool>
                                        ((internal *)local_b0,"true","message.packed_bool(0)",
                                         (bool *)&local_c0,(bool *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b6,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 5;
                              piVar2 = RepeatedField<int>::Get(local_88,0);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        ((internal *)local_b0,"unittest::FOREIGN_LITE_BAR",
                                         "message.packed_enum(0)",(ForeignEnumLite *)&local_c0,
                                         (ForeignEnumLite *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b7,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2bd;
                              piVar2 = RepeatedField<int>::Get(&(this->_impl_).packed_int32_,1);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"701","message.packed_int32(1)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2b9,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.83712e-43;
                              plVar3 = RepeatedField<long>::Get(this_00,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"702","message.packed_int64(1)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2ba,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2bf;
                              puVar4 = RepeatedField<unsigned_int>::Get(this_01,1);
                              local_c8.data_._0_4_ = (float)*puVar4;
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_b0,"703","message.packed_uint32(1)",
                                         (int *)&local_c0,(uint *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,699,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.86514e-43;
                              puVar5 = RepeatedField<unsigned_long>::Get(local_38,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*puVar5;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_b0,"704","message.packed_uint64(1)",
                                         (int *)&local_c8,(unsigned_long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,700,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2c1;
                              piVar2 = RepeatedField<int>::Get(local_40,1);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"705","message.packed_sint32(1)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2bd,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.89317e-43;
                              plVar3 = RepeatedField<long>::Get(local_48,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"706","message.packed_sint64(1)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2be,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2c3;
                              puVar4 = RepeatedField<unsigned_int>::Get(local_50,1);
                              local_c8.data_._0_4_ = (float)*puVar4;
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_b0,"707","message.packed_fixed32(1)",
                                         (int *)&local_c0,(uint *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2bf,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.92119e-43;
                              puVar5 = RepeatedField<unsigned_long>::Get(local_58,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*puVar5;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_b0,"708","message.packed_fixed64(1)",
                                         (int *)&local_c8,(unsigned_long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c0,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2c5;
                              piVar2 = RepeatedField<int>::Get(local_60,1);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_b0,"709","message.packed_sfixed32(1)",
                                         (int *)&local_c0,(int *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c1,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.94922e-43;
                              plVar3 = RepeatedField<long>::Get(local_68,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*plVar3;
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_b0,"710","message.packed_sfixed64(1)",
                                         (int *)&local_c8,(long *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c2,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c0._M_head_impl._0_4_ = 0x2c7;
                              pfVar6 = RepeatedField<float>::Get(local_70,1);
                              local_c8.data_._0_4_ = *pfVar6;
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)local_b0,"711","message.packed_float(1)",
                                         (int *)&local_c0,(float *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c3,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              local_c8.data_._0_4_ = 9.97725e-43;
                              pdVar7 = RepeatedField<double>::Get(local_78,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)*pdVar7;
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)local_b0,"712","message.packed_double(1)",
                                         (int *)&local_c8,(double *)&local_c0);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c4,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                              pbVar8 = RepeatedField<bool>::Get(local_80,1);
                              local_c0._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(CONCAT71(local_c0._M_head_impl._1_7_,*pbVar8) ^ 1);
                              local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              if (*pbVar8 == true) {
                                testing::Message::Message((Message *)&local_c8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_b0,(internal *)&local_c0,
                                           (AssertionResult *)"message.packed_bool(1)","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_90,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c5,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
                                testing::internal::AssertHelper::operator=
                                          (&local_90,(Message *)&local_c8);
                                testing::internal::AssertHelper::~AssertHelper(&local_90);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
                                  operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_b0._1_7_,local_b0[0]),
                                                  local_a0._M_allocated_capacity + 1);
                                }
                                if ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) !=
                                    (long *)0x0) {
                                  (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,
                                                                 local_c8.data_._0_4_) + 8))();
                                }
                              }
                              if (local_b8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_b8,local_b8);
                              }
                              local_c0._M_head_impl._0_4_ = 6;
                              piVar2 = RepeatedField<int>::Get(local_88,1);
                              local_c8.data_._0_4_ = (float)*piVar2;
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnumLite,proto2_unittest::ForeignEnumLite>
                                        ((internal *)local_b0,"unittest::FOREIGN_LITE_BAZ",
                                         "message.packed_enum(1)",(ForeignEnumLite *)&local_c0,
                                         (ForeignEnumLite *)&local_c8);
                              if (local_b0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_c0);
                                if (local_a8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = (local_a8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_c8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0x2c6,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          (&local_c8,(Message *)&local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_c8);
                                if (local_c0._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_c0._M_head_impl + 8))();
                                }
                              }
                              if (local_a8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_a8,local_a8);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectPackedFieldsSet(
    const unittest::TestPackedTypesLite& message) {
  ASSERT_EQ(2, message.packed_int32_size());
  ASSERT_EQ(2, message.packed_int64_size());
  ASSERT_EQ(2, message.packed_uint32_size());
  ASSERT_EQ(2, message.packed_uint64_size());
  ASSERT_EQ(2, message.packed_sint32_size());
  ASSERT_EQ(2, message.packed_sint64_size());
  ASSERT_EQ(2, message.packed_fixed32_size());
  ASSERT_EQ(2, message.packed_fixed64_size());
  ASSERT_EQ(2, message.packed_sfixed32_size());
  ASSERT_EQ(2, message.packed_sfixed64_size());
  ASSERT_EQ(2, message.packed_float_size());
  ASSERT_EQ(2, message.packed_double_size());
  ASSERT_EQ(2, message.packed_bool_size());
  ASSERT_EQ(2, message.packed_enum_size());

  EXPECT_EQ(601, message.packed_int32(0));
  EXPECT_EQ(602, message.packed_int64(0));
  EXPECT_EQ(603, message.packed_uint32(0));
  EXPECT_EQ(604, message.packed_uint64(0));
  EXPECT_EQ(605, message.packed_sint32(0));
  EXPECT_EQ(606, message.packed_sint64(0));
  EXPECT_EQ(607, message.packed_fixed32(0));
  EXPECT_EQ(608, message.packed_fixed64(0));
  EXPECT_EQ(609, message.packed_sfixed32(0));
  EXPECT_EQ(610, message.packed_sfixed64(0));
  EXPECT_EQ(611, message.packed_float(0));
  EXPECT_EQ(612, message.packed_double(0));
  EXPECT_EQ(true, message.packed_bool(0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR, message.packed_enum(0));

  EXPECT_EQ(701, message.packed_int32(1));
  EXPECT_EQ(702, message.packed_int64(1));
  EXPECT_EQ(703, message.packed_uint32(1));
  EXPECT_EQ(704, message.packed_uint64(1));
  EXPECT_EQ(705, message.packed_sint32(1));
  EXPECT_EQ(706, message.packed_sint64(1));
  EXPECT_EQ(707, message.packed_fixed32(1));
  EXPECT_EQ(708, message.packed_fixed64(1));
  EXPECT_EQ(709, message.packed_sfixed32(1));
  EXPECT_EQ(710, message.packed_sfixed64(1));
  EXPECT_EQ(711, message.packed_float(1));
  EXPECT_EQ(712, message.packed_double(1));
  EXPECT_FALSE(message.packed_bool(1));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ, message.packed_enum(1));
}